

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrEnumerateEnvironmentDepthSwapchainImagesMETA
                   (XrEnvironmentDepthSwapchainMETA swapchain,uint32_t imageCapacityInput,
                   uint32_t *imageCountOutput,XrSwapchainImageBaseHeader *images)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_environmentdepthswapchainmeta_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrSwapchainImageBaseHeader *images_local;
  uint32_t *imageCountOutput_local;
  uint32_t imageCapacityInput_local;
  XrEnvironmentDepthSwapchainMETA swapchain_local;
  
  pVar2 = HandleInfo<XrEnvironmentDepthSwapchainMETA_T_*>::getWithInstanceInfo
                    (&g_environmentdepthswapchainmeta_info,swapchain);
  XVar1 = (*(pVar2.second)->dispatch_table->EnumerateEnvironmentDepthSwapchainImagesMETA)
                    (swapchain,imageCapacityInput,imageCountOutput,images);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrEnumerateEnvironmentDepthSwapchainImagesMETA(
    XrEnvironmentDepthSwapchainMETA swapchain,
    uint32_t imageCapacityInput,
    uint32_t* imageCountOutput,
    XrSwapchainImageBaseHeader* images) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_environmentdepthswapchainmeta_info.getWithInstanceInfo(swapchain);
        GenValidUsageXrHandleInfo *gen_environmentdepthswapchainmeta_info = info_with_instance.first;
        (void)gen_environmentdepthswapchainmeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->EnumerateEnvironmentDepthSwapchainImagesMETA(swapchain, imageCapacityInput, imageCountOutput, images);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}